

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

ostream * Eigen::operator<<(ostream *s,DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *m)

{
  EvalReturnType _m;
  ostream *poVar1;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_129;
  string local_128;
  IOFormat local_108;
  DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *local_18;
  DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *m_local;
  ostream *s_local;
  
  local_18 = m;
  m_local = (DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)s;
  _m = DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::eval(m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128," ",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"\n",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"",&local_201);
  IOFormat::IOFormat(&local_108,-1,0,&local_128,&local_160,&local_188,&local_1b0,&local_1d8,
                     &local_200,' ');
  poVar1 = internal::print_matrix<Eigen::Matrix<float,_1,1,0,_1,1>>(s,_m,&local_108);
  IOFormat::~IOFormat(&local_108);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  return poVar1;
}

Assistant:

std::ostream & operator <<
(std::ostream & s,
 const DenseBase<Derived> & m)
{
  return internal::print_matrix(s, m.eval(), EIGEN_DEFAULT_IO_FORMAT);
}